

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

bool jsonip::parser::apply_until_<jsonip::parser::notchar_<(char)10>,jsonip::parser::new_line>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *state)

{
  bool bVar1;
  bool bVar2;
  bool var;
  ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *state_local;
  
  ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::push_state(state);
  do {
    bVar1 = new_line::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                      (state);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar2 = notchar_<(char)10>::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                      (state);
  } while (bVar2);
  if (bVar1) {
    ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::commit(state);
  }
  else {
    ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::rollback(state);
  }
  return bVar1;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = false;

            while (!(var = C1::match(state)))
                if (!C0::match(state)) break;

            var ? state.commit() : state.rollback();

            return var;
        }